

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> * __thiscall
docopt::BranchPattern::flat
          (vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *__return_storage_ptr__,
          BranchPattern *this,_func_bool_Pattern_ptr *filter)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  pointer psVar4;
  initializer_list<docopt::Pattern_*> __l;
  undefined1 local_50 [8];
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> sublist;
  
  bVar3 = (*filter)(&this->super_Pattern);
  if (bVar3) {
    __l._M_len = 1;
    __l._M_array = (iterator)local_50;
    local_50 = (undefined1  [8])this;
    std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::vector
              (__return_storage_ptr__,__l,
               (allocator_type *)
               ((long)&sublist.
                       super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    psVar1 = (this->fChildren).
             super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (this->fChildren).
                  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1)
    {
      peVar2 = (psVar4->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (**peVar2->_vptr_Pattern)
                ((_Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *)local_50,
                 peVar2,filter);
      std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>::
      insert<__gnu_cxx::__normal_iterator<docopt::Pattern**,std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>>,void>
                ((vector<docopt::Pattern*,std::allocator<docopt::Pattern*>> *)__return_storage_ptr__
                 ,(const_iterator)
                  (__return_storage_ptr__->
                  super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>)._M_impl
                  .super__Vector_impl_data._M_finish,
                 (__normal_iterator<docopt::Pattern_**,_std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>_>
                  )local_50,
                 (__normal_iterator<docopt::Pattern_**,_std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>_>
                  )sublist.super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      std::_Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::~_Vector_base
                ((_Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *)local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<Pattern*> flat(bool (*filter)(Pattern const*)) override {
			if (filter(this)) {
				return {this};
			}

			std::vector<Pattern*> ret;
			for(auto& child : fChildren) {
				auto sublist = child->flat(filter);
				ret.insert(ret.end(), sublist.begin(), sublist.end());
			}
			return ret;
		}